

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O2

void nn_bipc_destroy(nn_epbase *self)

{
  nn_fsm *self_00;
  
  self_00 = (nn_fsm *)(self + -6);
  if (self == (nn_epbase *)0x0) {
    self_00 = (nn_fsm *)0x0;
  }
  if (*(uint *)&self_00[1].fn == 1) {
    nn_list_term((nn_list *)&self_00[8].ctx);
    if (self_00[8].owner == (nn_fsm *)0x0) {
      nn_usock_term((nn_usock *)&self_00[1].srcptr);
      nn_backoff_term((nn_backoff *)&self_00[8].stopped.src);
      nn_epbase_term((nn_epbase *)&self_00[1].shutdown_fn);
      nn_fsm_term(self_00);
      nn_free(self_00);
      return;
    }
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","bipc->aipc == NULL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/bipc.c"
            ,0x9f);
  }
  else {
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)*(uint *)&self_00[1].fn,
            "NN_BIPC_STATE_IDLE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/bipc.c"
            ,0x9d);
  }
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_bipc_destroy (struct nn_epbase *self)
{
    struct nn_bipc *bipc;

    bipc = nn_cont (self, struct nn_bipc, epbase);

    nn_assert_state (bipc, NN_BIPC_STATE_IDLE);
    nn_list_term (&bipc->aipcs);
    nn_assert (bipc->aipc == NULL);
    nn_usock_term (&bipc->usock);
    nn_backoff_term (&bipc->retry);
    nn_epbase_term (&bipc->epbase);
    nn_fsm_term (&bipc->fsm);

    nn_free (bipc);
}